

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O2

int ndn_key_storage_add_trusted_certificate(ndn_data_t *certificate)

{
  ndn_ecc_pub_t *pnVar1;
  uint32_t key_id;
  int iVar2;
  long lVar3;
  ndn_ecc_pub_t *pnVar4;
  ndn_ecc_pub_t *ecc_pub;
  
  key_id = key_id_from_cert_name(&certificate->name);
  lVar3 = 0xb;
  pnVar4 = (ndn_ecc_pub_t *)(storage.hmac_keys[9].abs_key.key_value + 0x20);
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      ecc_pub = (ndn_ecc_pub_t *)0x0;
      break;
    }
    ecc_pub = pnVar4 + 1;
    pnVar1 = pnVar4 + 1;
    pnVar4 = ecc_pub;
  } while (pnVar1->key_id != 0xffffffff);
  iVar2 = ndn_ecc_pub_init(ecc_pub,certificate->content_value + (certificate->content_size - 0x40),
                           0x40,' ',key_id);
  return iVar2;
}

Assistant:

int
ndn_key_storage_add_trusted_certificate(const ndn_data_t* certificate)
{
  uint32_t keyid = key_id_from_cert_name(&certificate->name);
  // find an empty ECC key
  ndn_ecc_pub_t* pub_key = NULL;
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.trusted_ecc_pub_keys[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      pub_key = &storage.trusted_ecc_pub_keys[i];
      break;
    }
  }
  // load the certificate key into trusted ecc pub keys
  int ret = ndn_ecc_pub_init(pub_key,
                             certificate->content_value + (certificate->content_size - NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE),
                             NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE, NDN_ECDSA_CURVE_SECP256R1, keyid);
  if (ret != NDN_SUCCESS) return ret;
  return NDN_SUCCESS;
}